

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void prepare_pragma_string(char *repr,VARR_char *to)

{
  VARR_char *to_local;
  char *repr_local;
  
  destringify(repr,to);
  reverse(to);
  return;
}

Assistant:

static void prepare_pragma_string (const char *repr, VARR (char) * to) {
  destringify (repr, to);
  reverse (to);
}